

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertion_sort.h
# Opt level: O2

void insertion_sort(uchar **strings,int n,size_t depth)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar **ppuVar5;
  long lVar6;
  
  ppuVar4 = strings;
  do {
    if (n < 2) {
      return;
    }
    ppuVar4 = ppuVar4 + 1;
    n = n + -1;
    puVar3 = *ppuVar4;
    ppuVar5 = ppuVar4;
    while (strings < ppuVar5) {
      lVar6 = 0;
      while( true ) {
        bVar1 = ppuVar5[-1][lVar6];
        bVar2 = puVar3[lVar6];
        if ((bVar1 == 0) || (bVar1 != bVar2)) break;
        lVar6 = lVar6 + 1;
      }
      if (bVar1 <= bVar2) break;
      *ppuVar5 = ppuVar5[-1];
      ppuVar5 = ppuVar5 + -1;
    }
    *ppuVar5 = puVar3;
  } while( true );
}

Assistant:

static inline void
insertion_sort(unsigned char** strings, int n, size_t depth)
{
	for (unsigned char** i = strings + 1; --n > 0; ++i) {
		unsigned char** j = i;
		unsigned char* tmp = *i;
		while (j > strings) {
			unsigned char* s = *(j-1)+depth;
			unsigned char* t = tmp+depth;
			while (*s == *t and not is_end(*s)) {
				++s;
				++t;
			}
			if (*s <= *t) break;
			*j = *(j-1);
			--j;
		}
		*j = tmp;
	}
}